

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_convert_sect5obus_to_annexb(uint8_t *buffer,size_t buffer_size,size_t *frame_size)

{
  int iVar1;
  size_t available;
  uint64_t value;
  size_t sVar2;
  size_t __n;
  long lVar3;
  uint8_t saved_obu_header [2];
  uint64_t obu_payload_size;
  size_t coded_obu_size;
  size_t length_of_payload_size;
  byte local_72 [2];
  size_t local_70;
  uint64_t local_68;
  size_t *local_60;
  size_t local_58;
  uint64_t local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  
  sVar2 = *frame_size;
  local_60 = frame_size;
  if (sVar2 == 0) {
    local_70 = 0;
  }
  else {
    local_70 = 0;
    local_58 = buffer_size;
    do {
      __n = 2 - (ulong)((*buffer & 4) == 0);
      memcpy(local_72,buffer,__n);
      local_72[0] = local_72[0] & 0xfd;
      iVar1 = aom_uleb_decode(buffer + __n,sVar2 - __n,&local_68,&local_38);
      if (iVar1 != 0) {
        return 1;
      }
      lVar3 = local_38 + __n;
      value = local_68 + __n;
      available = aom_uleb_size_in_bytes(value);
      if (local_58 - (local_70 + (sVar2 - lVar3)) < available + __n) {
        return 1;
      }
      local_48 = sVar2;
      memmove(buffer + available + __n,buffer + lVar3,sVar2 - lVar3);
      local_50 = local_68;
      iVar1 = aom_uleb_encode(value,available,buffer,&local_40);
      if (iVar1 != 0) {
        return 1;
      }
      if (local_40 != available) {
        return 1;
      }
      memcpy(buffer + available,local_72,__n);
      buffer = buffer + available + value;
      local_70 = local_70 + available + value;
      sVar2 = local_48 - (lVar3 + local_50);
    } while (sVar2 != 0);
  }
  *local_60 = local_70;
  return 0;
}

Assistant:

int av1_convert_sect5obus_to_annexb(uint8_t *buffer, size_t buffer_size,
                                    size_t *frame_size) {
  assert(*frame_size <= buffer_size);
  size_t output_size = 0;
  size_t remaining_size = *frame_size;
  uint8_t *buff_ptr = buffer;

  // go through each OBUs
  while (remaining_size > 0) {
    uint8_t saved_obu_header[2];
    uint64_t obu_payload_size;
    size_t length_of_payload_size;
    size_t length_of_obu_size;
    const uint32_t obu_header_size = (buff_ptr[0] >> 2) & 0x1 ? 2 : 1;
    size_t obu_bytes_read = obu_header_size;  // bytes read for current obu

    // save the obu header (1 or 2 bytes)
    memcpy(saved_obu_header, buff_ptr, obu_header_size);
    // clear the obu_has_size_field
    saved_obu_header[0] &= ~0x2;

    // get the payload_size and length of payload_size
    if (aom_uleb_decode(buff_ptr + obu_header_size,
                        remaining_size - obu_header_size, &obu_payload_size,
                        &length_of_payload_size) != 0) {
      return AOM_CODEC_ERROR;
    }
    obu_bytes_read += length_of_payload_size;

    // calculate the length of size of the obu header plus payload
    const uint64_t obu_size = obu_header_size + obu_payload_size;
    length_of_obu_size = aom_uleb_size_in_bytes(obu_size);

    if (length_of_obu_size + obu_header_size >
        buffer_size - output_size - (remaining_size - obu_bytes_read)) {
      return AOM_CODEC_ERROR;
    }
    // move the rest of data to new location
    memmove(buff_ptr + length_of_obu_size + obu_header_size,
            buff_ptr + obu_bytes_read, remaining_size - obu_bytes_read);
    obu_bytes_read += (size_t)obu_payload_size;

    // write the new obu size
    size_t coded_obu_size;
    if (aom_uleb_encode(obu_size, length_of_obu_size, buff_ptr,
                        &coded_obu_size) != 0 ||
        coded_obu_size != length_of_obu_size) {
      return AOM_CODEC_ERROR;
    }

    // write the saved (modified) obu_header following obu size
    memcpy(buff_ptr + length_of_obu_size, saved_obu_header, obu_header_size);

    remaining_size -= obu_bytes_read;
    buff_ptr += length_of_obu_size + (size_t)obu_size;
    output_size += length_of_obu_size + (size_t)obu_size;
  }

  *frame_size = output_size;
  return AOM_CODEC_OK;
}